

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::finish(ezexample *this)

{
  example **ppeVar1;
  int iVar2;
  example ***pppeVar3;
  long in_RDI;
  example *ecc;
  example **__end2;
  example **__begin2;
  v_array<example_*> *__range2;
  example *in_stack_00000178;
  vw *in_stack_00000180;
  example *in_stack_ffffffffffffffa8;
  example *in_stack_ffffffffffffffb0;
  example **local_28;
  
  if (finish()::empty_example == '\0') {
    iVar2 = __cxa_guard_acquire(&finish()::empty_example);
    if (iVar2 != 0) {
      if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
        finish::empty_example = (example *)0x0;
      }
      else {
        finish::empty_example =
             VW::read_example((vw *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      }
      in_stack_ffffffffffffffb0 = finish::empty_example;
      __cxa_guard_release(&finish()::empty_example);
    }
  }
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    vw::learn(in_stack_00000180,in_stack_00000178);
    pppeVar3 = v_array<example_*>::begin((v_array<example_*> *)(in_RDI + 0x158));
    local_28 = *pppeVar3;
    pppeVar3 = v_array<example_*>::end((v_array<example_*> *)(in_RDI + 0x158));
    ppeVar1 = *pppeVar3;
    for (; local_28 != ppeVar1; local_28 = local_28 + 1) {
      if (((*local_28)->in_use & 1U) != 0) {
        VW::finish_example((vw *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
    v_array<example_*>::clear((v_array<example_*> *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void finish()
  {
    static example* empty_example = is_multiline ? VW::read_example(*vw_par_ref, (char*)"") : nullptr;
    if (is_multiline)
    {
      vw_ref->learn(*empty_example);
      for (auto ecc : example_copies)
        if (ecc->in_use)
          VW::finish_example(*vw_par_ref, *ecc);
      example_copies.clear();
    }
  }